

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

void observe_quantum_cat(obj *box)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  obj *poVar4;
  char *pcVar5;
  char *local_38;
  monst *local_30;
  xchar local_22;
  xchar local_21;
  xchar oy;
  monst *pmStack_20;
  xchar ox;
  monst *livecat;
  obj *deadcat;
  obj *box_local;
  
  box->spe = '\0';
  deadcat = box;
  bVar1 = get_obj_location(box,&local_21,&local_22,0);
  if (bVar1 != '\0') {
    deadcat->ox = local_21;
    deadcat->oy = local_22;
  }
  iVar2 = rn2(2);
  if (iVar2 == 0) {
    local_30 = (monst *)0x0;
  }
  else {
    local_30 = makemon(mons + 0x23,level,(int)deadcat->ox,(int)deadcat->oy,1);
  }
  pmStack_20 = local_30;
  if (local_30 == (monst *)0x0) {
    livecat = (monst *)mk_named_object(0x10e,mons + 0x23,(int)deadcat->ox,(int)deadcat->oy,
                                       "Schroedinger\'s Cat");
    if (livecat != (monst *)0x0) {
      obj_extract_self((obj *)livecat);
      add_to_container(deadcat,(obj *)livecat);
    }
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))) {
      local_38 = "housecat";
    }
    else {
      local_38 = rndmonnam();
    }
    pline("The %s inside the box is dead!",local_38);
    goto LAB_0028cbcc;
  }
  *(uint *)&local_30->field_0x60 = *(uint *)&local_30->field_0x60 & 0xffbfffff | 0x400000;
  set_malign(local_30);
  if (pmStack_20->wormno == '\0') {
    if (((viz_array[pmStack_20->my][pmStack_20->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((pmStack_20->data->mflags3 & 0x200) != 0 &&
          ((viz_array[pmStack_20->my][pmStack_20->mx] & 1U) != 0)))))))) goto LAB_0028c85d;
LAB_0028c8ea:
    if (((((pmStack_20->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(pmStack_20,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(pmStack_20,4), poVar4->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            ((((u.uprops[0x19].intrinsic != 0 ||
               ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
              (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
          (u.uprops[0x19].blocked == 0)) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar2 = dist2((int)pmStack_20->mx,(int)pmStack_20->my,(int)u.ux,(int)u.uy), iVar2 < 0x41)
          ))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon(pmStack_20), bVar1 != '\0')))) goto LAB_0028caca;
    pcVar5 = body_part(5);
    pline("You think something brushed your %s.",pcVar5);
  }
  else {
    bVar1 = worm_known(level,pmStack_20);
    if (bVar1 == '\0') goto LAB_0028c8ea;
LAB_0028c85d:
    if (((((((*(uint *)&pmStack_20->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&pmStack_20->field_0x60 >> 7 & 1) != 0 ||
         ((*(uint *)&pmStack_20->field_0x60 >> 9 & 1) != 0)))) || (((byte)u._1052_1_ >> 5 & 1) != 0)
       ) goto LAB_0028c8ea;
LAB_0028caca:
    pcVar5 = Monnam(pmStack_20);
    pline("%s inside the box is still alive!",pcVar5);
  }
  christen_monst(pmStack_20,"Schroedinger\'s Cat");
LAB_0028cbcc:
  uVar3 = weight(deadcat);
  deadcat->owt = uVar3;
  return;
}

Assistant:

static void observe_quantum_cat(struct obj *box)
{
    static const char sc[] = "Schroedinger's Cat";
    struct obj *deadcat;
    struct monst *livecat;
    xchar ox, oy;

    box->spe = 0;		/* box->owt will be updated below */
    if (get_obj_location(box, &ox, &oy, 0))
	box->ox = ox, box->oy = oy;	/* in case it's being carried */

    /* this isn't really right, since any form of observation
       (telepathic or monster/object/food detection) ought to
       force the determination of alive vs dead state; but basing
       it just on opening the box is much simpler to cope with */
    livecat = rn2(2) ? makemon(&mons[PM_HOUSECAT], level,
			       box->ox, box->oy, NO_MINVENT) : 0;
    if (livecat) {
	livecat->mpeaceful = 1;
	set_malign(livecat);
	if (!canspotmon(level, livecat))
	    pline("You think something brushed your %s.", body_part(FOOT));
	else
	    pline("%s inside the box is still alive!", Monnam(livecat));
	christen_monst(livecat, sc);
    } else {
	deadcat = mk_named_object(CORPSE, &mons[PM_HOUSECAT],
				  box->ox, box->oy, sc);
	if (deadcat) {
	    obj_extract_self(deadcat);
	    add_to_container(box, deadcat);
	}
	pline("The %s inside the box is dead!",
	    Hallucination ? rndmonnam() : "housecat");
    }
    box->owt = weight(box);
    return;
}